

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
pbrt::SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
          (SubsurfaceMaterial *this,TextureEvalContext *param_2,SampledWavelengths *param_3,
          float *param_4)

{
  ulong uVar1;
  undefined1 auVar13 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  ulong in_XMM1_Qb;
  undefined1 auVar25 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  SampledSpectrum SVar26;
  UniversalTextureEvaluator local_29d;
  Float local_29c;
  SampledSpectrum local_298;
  SampledSpectrum local_288;
  float *local_270;
  SampledSpectrum r;
  uintptr_t local_258;
  uintptr_t local_250;
  SampledSpectrum local_248;
  uintptr_t local_238;
  ulong local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  SampledSpectrum mfree;
  float fStack_198;
  float fStack_194;
  Float FStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  Tuple3<pbrt::Vector3,_float> aTStack_180 [2];
  Float FStack_168;
  undefined4 uStack_164;
  BSSRDFTable *pBStack_160;
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  float afStack_140 [68];
  
  local_288.values.values = (array<float,_4>)ZEXT816(0);
  local_298.values.values = (array<float,_4>)ZEXT816(0);
  uVar1 = (this->sigma_a).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  local_270 = param_4;
  if (((uVar1 & 0xffffffffffff) == 0) ||
     (((this->sigma_s).
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits & 0xffffffffffff) == 0)) {
    local_29c = this->scale;
    local_250 = (this->mfp).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_208 = *(undefined8 *)(param_3->lambda).values;
    uStack_200 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1f8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1f0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(*(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z);
    auVar25 = ZEXT856(in_XMM1_Qb);
    SVar26 = UniversalTextureEvaluator::operator()
                       (&local_29d,(SpectrumTextureHandle)&local_250,*param_2,*param_3);
    auVar20._0_8_ = SVar26.values.values._8_8_;
    auVar20._8_56_ = auVar25;
    auVar8._0_8_ = SVar26.values.values._0_8_;
    auVar8._8_56_ = auVar13;
    local_248.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar20._0_16_);
    auVar13 = (undefined1  [56])0x0;
    SVar26 = SampledSpectrum::operator*(&local_248,local_29c);
    auVar21._0_8_ = SVar26.values.values._8_8_;
    auVar21._8_56_ = auVar25;
    auVar9._0_8_ = SVar26.values.values._0_8_;
    auVar9._8_56_ = auVar13;
    r.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar21._0_16_);
    auVar13 = ZEXT856(r.values.values._8_8_);
    SVar26 = ClampZero(&r);
    auVar22._0_8_ = SVar26.values.values._8_8_;
    auVar22._8_56_ = auVar25;
    auVar10._0_8_ = SVar26.values.values._0_8_;
    auVar10._8_56_ = auVar13;
    mfree.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar22._0_16_);
    local_258 = (this->reflectance).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_228 = *(undefined8 *)(param_3->lambda).values;
    uStack_220 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_218 = *(undefined8 *)(param_3->pdf).values;
    uStack_210 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(*(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z);
    auVar25 = ZEXT856(auVar25._0_8_);
    SVar26 = UniversalTextureEvaluator::operator()
                       (&local_29d,(SpectrumTextureHandle)&local_258,*param_2,*param_3);
    auVar23._0_8_ = SVar26.values.values._8_8_;
    auVar23._8_56_ = auVar25;
    auVar11._0_8_ = SVar26.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    local_248.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar23._0_16_);
    auVar13 = ZEXT856(local_248.values.values._8_8_);
    SVar26 = Clamp<int,int>(&local_248,0,1);
    auVar24._0_8_ = SVar26.values.values._8_8_;
    auVar24._8_56_ = auVar25;
    auVar12._0_8_ = SVar26.values.values._0_8_;
    auVar12._8_56_ = auVar13;
    r.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar24._0_16_);
    SubsurfaceFromDiffuse(&this->table,&r,&mfree,&local_288,&local_298);
  }
  else {
    local_29c = this->scale;
    local_1c8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1c0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1b8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1b0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(*(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z);
    auVar25 = ZEXT856(in_XMM1_Qb);
    local_230 = uVar1;
    SVar26 = UniversalTextureEvaluator::operator()
                       (&local_29d,(SpectrumTextureHandle)&local_230,*param_2,*param_3);
    auVar14._0_8_ = SVar26.values.values._8_8_;
    auVar14._8_56_ = auVar25;
    auVar2._0_8_ = SVar26.values.values._0_8_;
    auVar2._8_56_ = auVar13;
    r.values.values = (array<float,_4>)vmovlhps_avx(auVar2._0_16_,auVar14._0_16_);
    auVar13 = (undefined1  [56])0x0;
    SVar26 = SampledSpectrum::operator*(&r,local_29c);
    auVar15._0_8_ = SVar26.values.values._8_8_;
    auVar15._8_56_ = auVar25;
    auVar3._0_8_ = SVar26.values.values._0_8_;
    auVar3._8_56_ = auVar13;
    mfree.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar15._0_16_);
    auVar13 = ZEXT856(mfree.values.values._8_8_);
    SVar26 = ClampZero(&mfree);
    auVar16._0_8_ = SVar26.values.values._8_8_;
    auVar16._8_56_ = auVar25;
    auVar4._0_8_ = SVar26.values.values._0_8_;
    auVar4._8_56_ = auVar13;
    local_288.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar16._0_16_);
    local_29c = this->scale;
    local_238 = (this->sigma_s).
                super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                .bits;
    local_1e8 = *(undefined8 *)(param_3->lambda).values;
    uStack_1e0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_1d8 = *(undefined8 *)(param_3->pdf).values;
    uStack_1d0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(*(ulong *)&(param_2->p).super_Tuple3<pbrt::Point3,_float>.z);
    auVar25 = ZEXT856(auVar25._0_8_);
    SVar26 = UniversalTextureEvaluator::operator()
                       (&local_29d,(SpectrumTextureHandle)&local_238,*param_2,*param_3);
    auVar17._0_8_ = SVar26.values.values._8_8_;
    auVar17._8_56_ = auVar25;
    auVar5._0_8_ = SVar26.values.values._0_8_;
    auVar5._8_56_ = auVar13;
    r.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar17._0_16_);
    auVar13 = (undefined1  [56])0x0;
    SVar26 = SampledSpectrum::operator*(&r,local_29c);
    auVar18._0_8_ = SVar26.values.values._8_8_;
    auVar18._8_56_ = auVar25;
    auVar6._0_8_ = SVar26.values.values._0_8_;
    auVar6._8_56_ = auVar13;
    mfree.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar18._0_16_);
    auVar13 = ZEXT856(mfree.values.values._8_8_);
    SVar26 = ClampZero(&mfree);
    auVar19._0_8_ = SVar26.values.values._8_8_;
    auVar19._8_56_ = auVar25;
    auVar7._0_8_ = SVar26.values.values._0_8_;
    auVar7._8_56_ = auVar13;
    local_298.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar19._0_16_);
  }
  TabulatedBSSRDF::TabulatedBSSRDF
            ((TabulatedBSSRDF *)&mfree,&param_2->p,(Vector3f *)&param_2[1].uv,
             (Normal3f *)&param_2[1].dpdy,(Vector3f *)(param_2 + 1),0.0,this->eta,&local_288,
             &local_298,&this->table);
  *(undefined8 *)(local_270 + 0xc) = aTStack_180._8_8_;
  local_270[0xe] = aTStack_180[1].y;
  local_270[0xf] = aTStack_180[1].z;
  local_270[0x10] = FStack_168;
  local_270[0x11] = (float)uStack_164;
  *(BSSRDFTable **)(local_270 + 0x12) = pBStack_160;
  *(float (*) [2])(local_270 + 0x14) = afStack_158;
  *(float (*) [2])(local_270 + 0x16) = afStack_150;
  *(float (*) [2])(local_270 + 0x18) = afStack_148;
  *(undefined8 *)(local_270 + 0x1a) = afStack_140._0_8_;
  *(undefined8 *)local_270 = mfree.values.values._0_8_;
  *(undefined8 *)(local_270 + 2) = mfree.values.values._8_8_;
  local_270[4] = fStack_198;
  local_270[5] = fStack_194;
  local_270[6] = FStack_190;
  local_270[7] = fStack_18c;
  local_270[8] = fStack_188;
  local_270[9] = fStack_184;
  local_270[10] = aTStack_180[0].x;
  local_270[0xb] = aTStack_180[0].y;
  *(undefined8 *)(local_270 + 0xc) = aTStack_180._8_8_;
  local_270[0xe] = aTStack_180[1].y;
  local_270[0xf] = aTStack_180[1].z;
  return;
}

Assistant:

PBRT_CPU_GPU void GetBSSRDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                                SampledWavelengths &lambda,
                                TabulatedBSSRDF *bssrdf) const {
        SampledSpectrum sig_a, sig_s;
        if (sigma_a && sigma_s) {
            // Evaluate textures for $\sigma_\roman{a}$ and $\sigma_\roman{s}$
            sig_a = ClampZero(scale * texEval(sigma_a, ctx, lambda));
            sig_s = ClampZero(scale * texEval(sigma_s, ctx, lambda));

        } else {
            // Compute _sig_a_ and _sig_s_ from reflectance and mfp
            DCHECK(reflectance && mfp);
            SampledSpectrum mfree = ClampZero(scale * texEval(mfp, ctx, lambda));
            SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
            SubsurfaceFromDiffuse(table, r, mfree, &sig_a, &sig_s);
        }
        *bssrdf = TabulatedBSSRDF(ctx.p, ctx.dpdus, ctx.ns, ctx.wo, 0 /* FIXME: si.time*/,
                                  eta, sig_a, sig_s, &table);
    }